

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall Tokenizer::tryToGetString(Tokenizer *this)

{
  Mark MVar1;
  char cVar2;
  char cVar3;
  Mark *pMVar4;
  runtime_error *this_00;
  stringstream ss;
  undefined1 local_231;
  undefined1 local_230 [8];
  undefined1 *local_228;
  undefined1 local_218 [16];
  byte local_208;
  Mark local_200;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  if (cVar2 == '\"') {
    Stream::advance(&this->stream_);
    while( true ) {
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == '\"') break;
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == -1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,"Unexpected end of stream!","");
        makeErrorMessage((string *)local_230,this,&local_1d0);
        std::runtime_error::runtime_error(this_00,(string *)local_230);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar3 = Stream::peek(&this->stream_);
      if (cVar3 == '\\') {
        Stream::advance(&this->stream_);
        cVar3 = handleEscapeSequence(this);
        local_230[0] = cVar3;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_230,1);
      }
      else {
        cVar3 = Stream::peek(&this->stream_);
        local_230[0] = cVar3;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_230,1);
      }
      Stream::advance(&this->stream_);
    }
    Stream::advance(&this->stream_);
    std::__cxx11::stringbuf::str();
    local_230._0_4_ = String;
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_1f0,local_1e8 + (long)local_1f0);
    local_208 = 0;
    (this->token_).type = local_230._0_4_;
    local_1f8 = &(this->token_).value;
    local_200 = MVar1;
    std::operator=(&local_1f8,(string *)&local_228,&local_231);
    (this->token_).mark = local_200;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_208]._M_data)
              ((anon_class_1_0_00000001 *)&local_1f8,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)&local_228);
    local_208 = 0xff;
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return cVar2 == '\"';
}

Assistant:

bool Tokenizer::tryToGetString()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(stream_.peek() == '\"')
  {
    stream_.advance();
    while(stream_.peek() != '\"')
    {
      if(stream_.peek() == EOF)
        throw std::runtime_error(makeErrorMessage("Unexpected end of stream!"));

      else if(stream_.peek() == '\\')
      {
        stream_.advance();
        ss << handleEscapeSequence();
      }
      else
        ss << (char)stream_.peek();
      stream_.advance();
    }
    stream_.advance();
  }
  else
    return false;

  token_ = Token{TokenType::String, ss.str(), mark};
  return true;
}